

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::IndexSelector::IndexSelector
          (IndexSelector *this,IndexRange *selectedRange,uint totalSize)

{
  ptrdiff_t pVar1;
  ptrdiff_t *in_RSI;
  IndexRange *in_RDI;
  IndexRange *in_stack_ffffffffffffff58;
  SparsityStructure *in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff7c;
  Selector *in_stack_ffffffffffffff80;
  MatrixDynSize *in_stack_ffffffffffffff88;
  long in_stack_ffffffffffffff90;
  Index in_stack_ffffffffffffff98;
  Index in_stack_ffffffffffffffa0;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffffa8;
  
  Selector::Selector(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  in_RDI->offset = (ptrdiff_t)&PTR__IndexSelector_003faf08;
  pVar1 = in_RSI[1];
  in_RDI[0xb].size = *in_RSI;
  in_RDI[0xc].offset = pVar1;
  iDynTree::MatrixDynSize::resize((ulong)&in_RDI[2].size,(ulong)*(uint *)(in_RSI + 1));
  toEigen(in_stack_ffffffffffffff88);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
  block<long,long>(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   in_stack_ffffffffffffff90,(long)in_stack_ffffffffffffff88);
  Eigen::
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>_>
  ::setIdentity((MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
                 *)0x34f807);
  SparsityStructure::addDenseBlock(in_stack_ffffffffffffff68,in_RDI,in_stack_ffffffffffffff58);
  return;
}

Assistant:

IndexSelector(const IndexRange& selectedRange, unsigned int totalSize)
                : Selector(static_cast<unsigned int>(selectedRange.size))
                , m_selectedIndex(selectedRange)
            {
                m_selectionMatrix.resize(static_cast<unsigned int>(selectedRange.size), totalSize);
                toEigen(m_selectionMatrix).block(0, selectedRange.offset, selectedRange.size, selectedRange.size).setIdentity();
                m_correspondingHessianSparsity.addDenseBlock(selectedRange, selectedRange);
            }